

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O3

level_enum spdlog::level::from_str(string *name)

{
  int iVar1;
  level_enum lVar2;
  basic_string_view<char> *pbVar3;
  
  pbVar3 = std::
           __find_if<fmt::v11::basic_string_view<char>const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (level_string_views,short_level_names,name);
  if (pbVar3 == (basic_string_view<char> *)short_level_names) {
    iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,"warn"
                   );
    if (iVar1 == 0) {
      lVar2 = warn;
    }
    else {
      iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                      "err");
      lVar2 = (uint)(iVar1 != 0) * 2 + err;
    }
  }
  else {
    lVar2 = (level_enum)((ulong)(pbVar3 + -0x4cd92) >> 4);
  }
  return lVar2;
}

Assistant:

SPDLOG_INLINE spdlog::level::level_enum from_str(const std::string &name) SPDLOG_NOEXCEPT {
    auto it = std::find(std::begin(level_string_views), std::end(level_string_views), name);
    if (it != std::end(level_string_views))
        return static_cast<level::level_enum>(std::distance(std::begin(level_string_views), it));

    // check also for "warn" and "err" before giving up..
    if (name == "warn") {
        return level::warn;
    }
    if (name == "err") {
        return level::err;
    }
    return level::off;
}